

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<matrix_sparse_row_test_constructor_and_row_indexing_Test>::
CreateTest(TestFactoryImpl<matrix_sparse_row_test_constructor_and_row_indexing_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<matrix_sparse_row_test_constructor_and_row_indexing_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x60);
  matrix_sparse_row_test_constructor_and_row_indexing_Test::
  matrix_sparse_row_test_constructor_and_row_indexing_Test
            ((matrix_sparse_row_test_constructor_and_row_indexing_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }